

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::
basic_cbor_parser<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
          (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *source,cbor_decode_options *options
          ,allocator<char> *alloc)

{
  allocator *in_RCX;
  ser_context *in_RDI;
  allocator_type *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  type_conflict tVar1;
  allocator<unsigned_char> *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff68;
  string *this_01;
  bytes_source *in_stack_ffffffffffffff70;
  vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_> *this_02;
  
  tVar1 = (type_conflict)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  ser_context::ser_context(in_RDI);
  in_RDI->_vptr_ser_context = (_func_int **)&PTR__basic_cbor_parser_01336230;
  *(undefined1 *)&in_RDI[1]._vptr_ser_context = 1;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ser_context + 1) = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ser_context + 2) = 0;
  *(undefined4 *)((long)&in_RDI[1]._vptr_ser_context + 4) = 0;
  in_RDI[2]._vptr_ser_context = (_func_int **)0x0;
  *(undefined4 *)&in_RDI[3]._vptr_ser_context = 0;
  std::bitset<3UL>::bitset((bitset<3UL> *)0x30af93);
  std::allocator<char>::allocator((allocator *)(in_RDI + 5));
  bytes_source::bytes_source<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,tVar1);
  this_00 = (allocator<unsigned_char> *)(in_RDI + 9);
  cbor_decode_options::cbor_decode_options
            ((cbor_decode_options *)this_00,(cbor_decode_options *)in_stack_ffffffffffffff58);
  this_01 = (string *)(in_RDI + 0xc);
  std::__cxx11::string::string(this_01,in_RCX);
  this_02 = (vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_> *)
            (in_RDI + 0x10);
  std::allocator<unsigned_char>::allocator<char>
            (this_00,(allocator<char> *)in_stack_ffffffffffffff58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
             (allocator_type *)in_stack_ffffffffffffff58);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x30b03c);
  std::allocator<jsoncons::cbor::parse_state>::allocator<char>
            ((allocator<jsoncons::cbor::parse_state> *)this_00,
             (allocator<char> *)in_stack_ffffffffffffff58);
  std::vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::vector
            ((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_> *)
             this_00,(allocator_type *)in_stack_ffffffffffffff58);
  std::allocator<jsoncons::cbor::parse_state>::~allocator
            ((allocator<jsoncons::cbor::parse_state> *)0x30b07c);
  std::allocator<unsigned_char>::allocator<char>
            (this_00,(allocator<char> *)in_stack_ffffffffffffff58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
             (allocator_type *)in_stack_ffffffffffffff58);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x30b0bc);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x30b0d2);
  std::
  allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>
  ::allocator<char>((allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>
                     *)this_00,(allocator<char> *)in_stack_ffffffffffffff58);
  std::
  vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>_>
  ::vector((vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>_>
            *)this_00,in_stack_ffffffffffffff58);
  std::
  allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>
  ::~allocator((allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>
                *)0x30b112);
  std::vector<jsoncons::cbor::parse_state,std::allocator<jsoncons::cbor::parse_state>>::
  emplace_back<jsoncons::cbor::parse_mode,int>(this_02,(parse_mode *)this_01,(int *)this_00);
  return;
}

Assistant:

basic_cbor_parser(Sourceable&& source,
                      const cbor_decode_options& options = cbor_decode_options(),
                      const Allocator& alloc = Allocator())
       : alloc_(alloc),
         source_(std::forward<Sourceable>(source)),
         options_(options),
         text_buffer_(alloc),
         bytes_buffer_(alloc),
         state_stack_(alloc),
         typed_array_(alloc),
         stringref_map_stack_(alloc)
    {
        state_stack_.emplace_back(parse_mode::root,0);
    }